

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_swift.cpp
# Opt level: O2

void __thiscall
flatbuffers::swift::SwiftGenerator::BuildObjectAPIConstructorBodyVectors
          (SwiftGenerator *this,FieldDef *field,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *buffer_constructor,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *base_constructor,string *indentation)

{
  BaseType BVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  string default_value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  allocator<char> local_139;
  string *local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  Type local_f0;
  string field_var;
  string field_field;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50;
  
  BVar1 = (field->value).type.element;
  local_f0.fixed_length = (field->value).type.fixed_length;
  local_f0.element = BASE_TYPE_NONE;
  local_f0.struct_def._0_4_ = *(undefined4 *)&(field->value).type.struct_def;
  local_f0.struct_def._4_4_ = *(undefined4 *)((long)&(field->value).type.struct_def + 4);
  local_f0.enum_def._0_4_ = *(undefined4 *)&(field->value).type.enum_def;
  local_f0.enum_def._4_4_ = *(undefined4 *)((long)&(field->value).type.enum_def + 4);
  local_138 = indentation;
  local_f0.base_type = BVar1;
  (*(this->namer_).super_Namer._vptr_Namer[0x12])(&field_var,&this->namer_,field);
  (*(this->namer_).super_Namer._vptr_Namer[0x12])(&field_field,&this->namer_,field);
  if (BVar1 == BASE_TYPE_UTYPE) goto LAB_00222297;
  std::operator+(&default_value,&field_var," = []");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)buffer_constructor
             ,&default_value);
  std::__cxx11::string::~string((string *)&default_value);
  std::operator+(&local_160,"for index in 0..<_t.",&field_field);
  std::operator+(&default_value,&local_160,"Count {");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)buffer_constructor
             ,&default_value);
  std::__cxx11::string::~string((string *)&default_value);
  std::__cxx11::string::~string((string *)&local_160);
  std::operator+(&default_value,&field_var," = []");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)base_constructor,
             &default_value);
  std::__cxx11::string::~string((string *)&default_value);
  switch(local_f0.base_type) {
  case BASE_TYPE_VECTOR:
  case BASE_TYPE_ARRAY:
    break;
  case BASE_TYPE_STRUCT:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&default_value,"VALUETYPE",(allocator<char> *)&local_130);
    GenType_abi_cxx11_(&local_160,this,&local_f0,true);
    CodeWriter::SetValue(&this->code_,&default_value,&local_160);
    std::__cxx11::string::~string((string *)&local_160);
    std::__cxx11::string::~string((string *)&default_value);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"{{ACCESS_TYPE}} var {{FIELDVAR}}: [{{VALUETYPE}}?]",
               (allocator<char> *)&default_value);
    CodeWriter::operator+=(&this->code_,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    if (*(char *)(CONCAT44(local_f0.struct_def._4_4_,local_f0.struct_def._0_4_) + 0x110) == '\0') {
      std::operator+(&local_130,local_138,"var __v_ = _t.");
      std::operator+(&local_160,&local_130,&field_field);
      std::operator+(&default_value,&local_160,"(at: index)");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 buffer_constructor,&default_value);
      std::__cxx11::string::~string((string *)&default_value);
      std::__cxx11::string::~string((string *)&local_160);
      std::__cxx11::string::~string((string *)&local_130);
      std::operator+(&local_160,local_138,&field_var);
      std::operator+(&default_value,&local_160,".append(__v_?.unpack())");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 buffer_constructor,&default_value);
      std::__cxx11::string::~string((string *)&default_value);
      this_00 = &local_160;
    }
    else {
      std::operator+(&local_110,local_138,&field_var);
      std::operator+(&local_130,&local_110,".append(_t.");
      std::operator+(&local_160,&local_130,&field_var);
      std::operator+(&default_value,&local_160,"(at: index))");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 buffer_constructor,&default_value);
LAB_002220c8:
      std::__cxx11::string::~string((string *)&default_value);
      std::__cxx11::string::~string((string *)&local_160);
      std::__cxx11::string::~string((string *)&local_130);
      this_00 = &local_110;
    }
LAB_00222259:
    std::__cxx11::string::~string((string *)this_00);
    break;
  case BASE_TYPE_UNION:
    BuildUnionEnumSwitchCase
              (this,(field->value).type.enum_def,&field_var,buffer_constructor,local_138,true);
    break;
  default:
    if (local_f0.base_type != BASE_TYPE_UTYPE) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&default_value,"VALUETYPE",(allocator<char> *)&local_130);
      if (local_f0.base_type == BASE_TYPE_STRING) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_160,"String?",&local_139);
      }
      else {
        GenType_abi_cxx11_(&local_160,this,&local_f0,false);
      }
      CodeWriter::SetValue(&this->code_,&default_value,&local_160);
      std::__cxx11::string::~string((string *)&local_160);
      std::__cxx11::string::~string((string *)&default_value);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_70,"{{ACCESS_TYPE}} var {{FIELDVAR}}: [{{VALUETYPE}}]",
                 (allocator<char> *)&default_value);
      CodeWriter::operator+=(&this->code_,&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      if ((CONCAT44(local_f0.enum_def._4_4_,local_f0.enum_def._0_4_) == 0) ||
         (9 < local_f0.base_type - BASE_TYPE_UTYPE)) {
        std::operator+(&local_110,local_138,&field_var);
        std::operator+(&local_130,&local_110,".append(_t.");
        std::operator+(&local_160,&local_130,&field_field);
        std::operator+(&default_value,&local_160,"(at: index))");
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   buffer_constructor,&default_value);
        goto LAB_002220c8;
      }
      if (((field->value).type.enum_def == (EnumDef *)0x0) ||
         (9 < (field->value).type.base_type - BASE_TYPE_UTYPE)) {
        SwiftConstant_abi_cxx11_(&default_value,this,field);
      }
      else {
        GenEnumDefaultValue_abi_cxx11_(&default_value,this,field);
      }
      std::operator+(&local_90,local_138,&field_var);
      std::operator+(&local_110,&local_90,".append(_t.");
      std::operator+(&local_130,&local_110,&field_field);
      std::operator+(&local_160,&local_130,"(at: index)!)");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 buffer_constructor,&local_160);
      std::__cxx11::string::~string((string *)&local_160);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&local_90);
      this_00 = &default_value;
      goto LAB_00222259;
    }
  }
  if (local_f0.base_type != BASE_TYPE_UTYPE) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&default_value,"}",(allocator<char> *)&local_160);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               buffer_constructor,&default_value);
    std::__cxx11::string::~string((string *)&default_value);
  }
LAB_00222297:
  std::__cxx11::string::~string((string *)&field_field);
  std::__cxx11::string::~string((string *)&field_var);
  return;
}

Assistant:

void BuildObjectAPIConstructorBodyVectors(
      const FieldDef &field, std::vector<std::string> &buffer_constructor,
      std::vector<std::string> &base_constructor,
      const std::string &indentation) {
    const auto vectortype = field.value.type.VectorType();
    const auto field_var = namer_.Field(field);
    const auto field_field = namer_.Field(field);

    if (vectortype.base_type != BASE_TYPE_UTYPE) {
      buffer_constructor.push_back(field_var + " = []");
      buffer_constructor.push_back("for index in 0..<_t." + field_field +
                                   "Count {");
      base_constructor.push_back(field_var + " = []");
    }

    switch (vectortype.base_type) {
      case BASE_TYPE_STRUCT: {
        code_.SetValue("VALUETYPE", GenType(vectortype, true));
        code_ += "{{ACCESS_TYPE}} var {{FIELDVAR}}: [{{VALUETYPE}}?]";
        if (!vectortype.struct_def->fixed) {
          buffer_constructor.push_back(indentation + "var __v_ = _t." +
                                       field_field + "(at: index)");
          buffer_constructor.push_back(indentation + field_var +
                                       ".append(__v_?.unpack())");
        } else {
          buffer_constructor.push_back(indentation + field_var + ".append(_t." +
                                       field_var + "(at: index))");
        }
        break;
      }
      case BASE_TYPE_ARRAY: FLATBUFFERS_FALLTHROUGH();
      case BASE_TYPE_VECTOR: {
        break;
      }
      case BASE_TYPE_UNION: {
        BuildUnionEnumSwitchCase(*field.value.type.enum_def, field_var,
                                 buffer_constructor, indentation, true);
        break;
      }
      case BASE_TYPE_UTYPE: break;
      default: {
        code_.SetValue(
            "VALUETYPE",
            (IsString(vectortype) ? "String?" : GenType(vectortype)));
        code_ += "{{ACCESS_TYPE}} var {{FIELDVAR}}: [{{VALUETYPE}}]";

        if (IsEnum(vectortype) && vectortype.base_type != BASE_TYPE_UNION) {
          const auto default_value = IsEnum(field.value.type)
                                         ? GenEnumDefaultValue(field)
                                         : SwiftConstant(field);
          buffer_constructor.push_back(indentation + field_var + ".append(_t." +
                                       field_field + "(at: index)!)");
          break;
        }
        buffer_constructor.push_back(indentation + field_var + ".append(_t." +
                                     field_field + "(at: index))");
        break;
      }
    }
    if (vectortype.base_type != BASE_TYPE_UTYPE)
      buffer_constructor.push_back("}");
  }